

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManSetupSet(If_Man_t *p,If_Set_t *pSet)

{
  short sVar1;
  If_Cut_t **ppIVar2;
  int local_24;
  int i;
  char *pArray;
  If_Set_t *pSet_local;
  If_Man_t *p_local;
  
  pSet->nCuts = 0;
  pSet->nCutsMax = (short)p->pPars->nCutsMax;
  pSet->ppCuts = (If_Cut_t **)(pSet + 1);
  ppIVar2 = pSet->ppCuts;
  sVar1 = pSet->nCutsMax;
  for (local_24 = 0; local_24 <= pSet->nCutsMax; local_24 = local_24 + 1) {
    pSet->ppCuts[local_24] =
         (If_Cut_t *)((long)ppIVar2 + (long)(local_24 * p->nCutBytes) + (long)(sVar1 + 1) * 8);
    If_CutSetup(p,pSet->ppCuts[local_24]);
  }
  return;
}

Assistant:

void If_ManSetupSet( If_Man_t * p, If_Set_t * pSet )
{
    char * pArray;
    int i;
    pSet->nCuts = 0;
    pSet->nCutsMax = p->pPars->nCutsMax;
    pSet->ppCuts = (If_Cut_t **)(pSet + 1);
    pArray = (char *)pSet->ppCuts + sizeof(If_Cut_t *) * (pSet->nCutsMax+1);
    for ( i = 0; i <= pSet->nCutsMax; i++ )
    {
        pSet->ppCuts[i] = (If_Cut_t *)(pArray + i * p->nCutBytes); 
        If_CutSetup( p, pSet->ppCuts[i] );
    }
//    pArray += (pSet->nCutsMax + 1) * p->nCutBytes;
//    assert( ((char *)pArray) - ((char *)pSet) == p->nSetBytes );
}